

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkPipelineDepthStencilStateCreateInfo *
Diligent::DepthStencilStateDesc_To_VkDepthStencilStateCI
          (VkPipelineDepthStencilStateCreateInfo *__return_storage_ptr__,
          DepthStencilStateDesc *DepthStencilDesc)

{
  VkCompareOp VVar1;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->depthTestEnable = 0;
  __return_storage_ptr__->depthWriteEnable = 0;
  __return_storage_ptr__->depthCompareOp = VK_COMPARE_OP_NEVER;
  __return_storage_ptr__->minDepthBounds = 0.0;
  __return_storage_ptr__->maxDepthBounds = 0.0;
  (__return_storage_ptr__->back).compareOp = VK_COMPARE_OP_NEVER;
  (__return_storage_ptr__->back).compareMask = 0;
  (__return_storage_ptr__->back).writeMask = 0;
  (__return_storage_ptr__->back).reference = 0;
  *(undefined8 *)&(__return_storage_ptr__->front).reference = 0;
  (__return_storage_ptr__->back).passOp = VK_STENCIL_OP_KEEP;
  (__return_storage_ptr__->back).depthFailOp = VK_STENCIL_OP_KEEP;
  (__return_storage_ptr__->front).depthFailOp = VK_STENCIL_OP_KEEP;
  (__return_storage_ptr__->front).compareOp = VK_COMPARE_OP_NEVER;
  (__return_storage_ptr__->front).compareMask = 0;
  (__return_storage_ptr__->front).writeMask = 0;
  __return_storage_ptr__->depthBoundsTestEnable = 0;
  __return_storage_ptr__->stencilTestEnable = 0;
  (__return_storage_ptr__->front).failOp = VK_STENCIL_OP_KEEP;
  (__return_storage_ptr__->front).passOp = VK_STENCIL_OP_KEEP;
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->depthTestEnable = (uint)DepthStencilDesc->DepthEnable;
  __return_storage_ptr__->depthWriteEnable = (uint)DepthStencilDesc->DepthWriteEnable;
  VVar1 = ComparisonFuncToVkCompareOp(DepthStencilDesc->DepthFunc);
  __return_storage_ptr__->depthCompareOp = VVar1;
  __return_storage_ptr__->depthBoundsTestEnable = 0;
  __return_storage_ptr__->stencilTestEnable = (uint)DepthStencilDesc->StencilEnable;
  StencilOpDescToVkStencilOpState
            (&__return_storage_ptr__->front,&DepthStencilDesc->FrontFace,
             DepthStencilDesc->StencilReadMask,DepthStencilDesc->StencilWriteMask);
  StencilOpDescToVkStencilOpState
            (&__return_storage_ptr__->back,&DepthStencilDesc->BackFace,
             DepthStencilDesc->StencilReadMask,DepthStencilDesc->StencilWriteMask);
  __return_storage_ptr__->minDepthBounds = 0.0;
  __return_storage_ptr__->maxDepthBounds = 1.0;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineDepthStencilStateCreateInfo DepthStencilStateDesc_To_VkDepthStencilStateCI(const DepthStencilStateDesc& DepthStencilDesc)
{
    // Depth-stencil state
    VkPipelineDepthStencilStateCreateInfo DSStateCI = {};

    DSStateCI.sType                 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
    DSStateCI.pNext                 = nullptr;
    DSStateCI.flags                 = 0; // reserved for future use
    DSStateCI.depthTestEnable       = DepthStencilDesc.DepthEnable ? VK_TRUE : VK_FALSE;
    DSStateCI.depthWriteEnable      = DepthStencilDesc.DepthWriteEnable ? VK_TRUE : VK_FALSE;
    DSStateCI.depthCompareOp        = ComparisonFuncToVkCompareOp(DepthStencilDesc.DepthFunc); // 25.10
    DSStateCI.depthBoundsTestEnable = VK_FALSE;                                                // 25.8
    DSStateCI.stencilTestEnable     = DepthStencilDesc.StencilEnable ? VK_TRUE : VK_FALSE;     // 25.9
    DSStateCI.front                 = StencilOpDescToVkStencilOpState(DepthStencilDesc.FrontFace, DepthStencilDesc.StencilReadMask, DepthStencilDesc.StencilWriteMask);
    DSStateCI.back                  = StencilOpDescToVkStencilOpState(DepthStencilDesc.BackFace, DepthStencilDesc.StencilReadMask, DepthStencilDesc.StencilWriteMask);
    // Depth Bounds Test
    DSStateCI.minDepthBounds = 0; // must be between 0.0 and 1.0, inclusive
    DSStateCI.maxDepthBounds = 1; // must be between 0.0 and 1.0, inclusive

    return DSStateCI;
}